

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

void __thiscall MppDevServer::MppDevServer(MppDevServer *this)

{
  int iVar1;
  MPP_RET MVar2;
  MppServiceCmdCap *cap;
  char *pcVar3;
  MppMemPool pvVar4;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_24;
  
  pthread_mutexattr_init(&local_24);
  pthread_mutexattr_settype(&local_24,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_24);
  pthread_mutexattr_destroy(&local_24);
  this->mServerError = (char *)0x0;
  this->mServerName = (char *)0x0;
  this->mInited = 0;
  this->mEnable = 1;
  this->mCmdCap = (MppServiceCmdCap *)0x0;
  this->mSessionPool = (MppMemPool)0x0;
  this->mBatchPool = (MppMemPool)0x0;
  this->mMaxTaskInBatch = 0;
  mpp_env_get_u32("mpp_server_debug",&mpp_server_debug,0);
  mpp_env_get_u32("mpp_server_enable",&this->mEnable,1);
  mpp_env_get_u32("mpp_server_batch_task",(RK_U32 *)&this->mMaxTaskInBatch,8);
  if ((0x1f < this->mMaxTaskInBatch - 1U) &&
     (_mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mMaxTaskInBatch >= 1 && mMaxTaskInBatch <= 32","MppDevServer",0x252),
     (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  iVar1 = this->mMaxTaskInBatch;
  cap = mpp_get_mpp_service_cmd_cap();
  this->mCmdCap = cap;
  MVar2 = mpp_service_check_cmd_valid(0x204,cap);
  if (MVar2 != MPP_OK) {
    this->mServerError = "mpp_service cmd not support";
    return;
  }
  pcVar3 = mpp_get_mpp_service_name();
  this->mServerName = pcVar3;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "get service device failed";
  }
  else {
    pvVar4 = mpp_mem_pool_init_f("MppDevServer",0x1d8);
    this->mSessionPool = pvVar4;
    if (pvVar4 == (MppMemPool)0x0) {
      pcVar3 = "create session pool failed";
    }
    else {
      pvVar4 = mpp_mem_pool_init_f("MppDevServer",(long)(iVar1 * 0x1c0 + 0x60));
      this->mBatchPool = pvVar4;
      if (pvVar4 != (MppMemPool)0x0) {
        this->mInited = 1;
        goto LAB_0011f5b5;
      }
      pcVar3 = "create batch tack pool failed";
    }
  }
  this->mServerError = pcVar3;
LAB_0011f5b5:
  if (this->mInited == 0) {
    clear(this);
  }
  else {
    memset(this->mBatServer,0,0xf0);
  }
  return;
}

Assistant:

MppDevServer::MppDevServer() :
    mServerError(NULL),
    mServerName(NULL),
    mInited(0),
    mEnable(1),
    mSessionPool(NULL),
    mBatchPool(NULL),
    mMaxTaskInBatch(0),
    mCmdCap(NULL)
{
    RK_S32 batch_task_size = 0;

    mpp_env_get_u32("mpp_server_debug", &mpp_server_debug, 0);
    mpp_env_get_u32("mpp_server_enable", &mEnable, 1);
    mpp_env_get_u32("mpp_server_batch_task", (RK_U32 *)&mMaxTaskInBatch,
                    MAX_BATCH_TASK);

    mpp_assert(mMaxTaskInBatch >= 1 && mMaxTaskInBatch <= 32);
    batch_task_size = sizeof(MppDevBatTask) + mMaxTaskInBatch *
                      (sizeof(MppReqV1) * (MAX_REQ_SEND_CNT + MAX_REQ_WAIT_CNT) +
                       sizeof(MppDevBatCmd));

    mCmdCap = mpp_get_mpp_service_cmd_cap();
    if (MPP_OK != mpp_service_check_cmd_valid(MPP_CMD_SET_SESSION_FD, mCmdCap)) {
        mServerError = "mpp_service cmd not support";
        return;
    }

    do {
        mServerName = mpp_get_mpp_service_name();
        if (NULL == mServerName) {
            mServerError = "get service device failed";
            break;
        }

        mSessionPool = mpp_mem_pool_init(sizeof(MppDevSession));
        if (NULL == mSessionPool) {
            mServerError = "create session pool failed";
            break;
        }

        mBatchPool = mpp_mem_pool_init(batch_task_size);
        if (NULL == mBatchPool) {
            mServerError = "create batch tack pool failed";
            break;
        }

        mInited = 1;
    } while (0);

    if (!mInited) {
        clear();
        return;
    }

    memset(mBatServer, 0, sizeof(mBatServer));
}